

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O0

void __thiscall
google::protobuf::internal::ParseContext::ParseContext<std::__cxx11::string&>
          (ParseContext *this,long param_2,undefined8 *param_3,string *param_4)

{
  string_view flat;
  char *pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local;
  char **start_local;
  ParseContext *ctx_local;
  ParseContext *this_local;
  
  EpsCopyInputStream::EpsCopyInputStream(&this->super_EpsCopyInputStream,false);
  this->depth_ = *(int *)(param_2 + 0x58);
  this->group_depth_ = -0x80000000;
  (this->data_).pool = *(DescriptorPool **)(param_2 + 0x60);
  (this->data_).factory = *(MessageFactory **)(param_2 + 0x68);
  flat = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(param_4);
  pcVar1 = EpsCopyInputStream::InitFrom(&this->super_EpsCopyInputStream,flat);
  *param_3 = pcVar1;
  return;
}

Assistant:

ParseContext(Spawn, const ParseContext& ctx, const char** start, T&&... args)
      : EpsCopyInputStream(false),
        depth_(ctx.depth_),
        data_(ctx.data_)
  {
    *start = InitFrom(std::forward<T>(args)...);
  }